

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O2

int Cba_NtkPrepareBits(Cba_Ntk_t *p)

{
  int iVar1;
  int Entry;
  int f;
  
  Entry = 0;
  Vec_IntFill(&p->vFonCopy,(p->vFonObj).nCap,0);
  f = 1;
  while( true ) {
    if ((p->vFonObj).nSize <= f) {
      return Entry;
    }
    iVar1 = Cba_FonCopy(p,f);
    if (iVar1 != 0) break;
    Vec_IntWriteEntry(&p->vFonCopy,f,Entry);
    iVar1 = Cba_FonRangeSize(p,f);
    Entry = Entry + iVar1;
    f = f + 1;
  }
  __assert_fail("Cba_FonCopy(p, f) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x189,"void Cba_FonSetCopy(Cba_Ntk_t *, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Helper functions.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Cba_NtkPrepareBits( Cba_Ntk_t * p )
{
    int i, nBits = 0;
    Cba_NtkCleanFonCopies( p );
    Cba_NtkForEachFon( p, i )
    {
        Cba_FonSetCopy( p, i, nBits );
        nBits += Cba_FonRangeSize( p, i );
    }
    return nBits;
}